

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O3

void __thiscall
glcts::ViewportArray::DrawTestBase::setup2x2Viewport(DrawTestBase *this,PROVOKING_VERTEX provoking)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  TestError *this_00;
  int iVar7;
  bool bVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  GLfloat data [16];
  undefined4 local_58 [16];
  long lVar6;
  
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  uVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  iVar3 = 0;
  uVar10 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    iVar7 = iVar3 * 4;
    iVar3 = iVar3 + 2;
    uVar11 = 0;
    bVar1 = true;
    do {
      bVar8 = bVar1;
      local_58[iVar7] = uVar11;
      local_58[iVar7 + 1] = uVar10;
      local_58[iVar7 + 2] = 0x42800000;
      local_58[iVar7 + 3] = 0x42800000;
      iVar7 = iVar7 + 4;
      uVar11 = 0x42800000;
      bVar1 = false;
    } while (bVar8);
    uVar10 = 0x42800000;
    bVar1 = false;
  } while (bVar2);
  (**(code **)(lVar6 + 0x1a08))(0,4,local_58);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"ViewportArrayv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0xccd);
  if ((uVar4 & 0x300) == 0x100) {
    uVar9 = 0x8e4d;
    if (provoking != FIRST) {
      if (provoking != LAST) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invalid enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                   ,0xcdb);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      uVar9 = 0x8e4e;
    }
    (**(code **)(lVar6 + 0x11f0))(uVar9);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"ProvokingVertex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0xcdf);
  }
  return;
}

Assistant:

void DrawTestBase::setup2x2Viewport(PROVOKING_VERTEX provoking)
{
	const glw::Functions&   gl			 = m_context.getRenderContext().getFunctions();
	const glu::ContextType& context_type = m_context.getRenderContext().getType();

	GLint   index = 0;
	GLfloat data[4 * 4 /* 4x4 * (x + y + w + h) */];

	GLfloat width  = (GLfloat)(m_width / 2);
	GLfloat height = (GLfloat)(m_height / 2);

	for (GLuint y = 0; y < 2; ++y)
	{
		for (GLuint x = 0; x < 2; ++x)
		{
			data[index * 4 + 0] = (GLfloat)((GLfloat)x * width);
			data[index * 4 + 1] = (GLfloat)((GLfloat)y * height);
			data[index * 4 + 2] = width;
			data[index * 4 + 3] = height;

			index += 1;
		}
	}

	gl.viewportArrayv(0 /* first */, 4 /*count */, data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ViewportArrayv");

	if (glu::isContextTypeGLCore(context_type))
	{
		GLenum mode = 0;
		switch (provoking)
		{
		case FIRST:
			mode = GL_FIRST_VERTEX_CONVENTION;
			break;
		case LAST:
			mode = GL_LAST_VERTEX_CONVENTION;
			break;
		default:
			TCU_FAIL("Invalid enum");
		}

		gl.provokingVertex(mode);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ProvokingVertex");
	}
	else
	{
		/* can't control the provoking vertex in ES yet - it stays as LAST */
		DE_ASSERT(glu::isContextTypeES(context_type));
		DE_UNREF(provoking);
	}
}